

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

Component __thiscall ftxui::Container::Tab(Container *this,Components *children,int *selector)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_30;
  int *selector_local;
  Components *children_local;
  
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)selector;
  selector_local = (int *)children;
  children_local = (Components *)this;
  std::
  make_shared<ftxui::TabContainer,std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>,int*&>
            (&local_30,(int **)children);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::TabContainer,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,(shared_ptr<ftxui::TabContainer> *)&local_30);
  std::shared_ptr<ftxui::TabContainer>::~shared_ptr((shared_ptr<ftxui::TabContainer> *)&local_30);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Tab(Components children, int* selector) {
  return std::make_shared<TabContainer>(std::move(children), selector);
}